

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGlobVerificationManager.cxx
# Opt level: O0

bool __thiscall
cmGlobVerificationManager::SaveVerificationScript
          (cmGlobVerificationManager *this,string *path,cmMessenger *messenger)

{
  cmAlphaNum *this_00;
  undefined8 this_01;
  bool bVar1;
  byte bVar2;
  uint uVar3;
  ostream *poVar4;
  reference __in;
  type *ptVar5;
  type *ptVar6;
  pointer *this_02;
  type *ptVar7;
  type *bt_00;
  char *pcVar8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_698;
  undefined1 local_678 [8];
  ofstream verifyStampFile;
  string *file;
  iterator __end2_1;
  iterator __begin2_1;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *__range2_1;
  string local_450;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmListFileBacktrace>
  *local_430;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmListFileBacktrace>
  *bt;
  iterator __end2;
  iterator __begin2;
  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmListFileBacktrace>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmListFileBacktrace>_>_>
  *__range2;
  CacheEntryValue v;
  CacheEntryKey k;
  pair<const_cmGlobVerificationManager::CacheEntryKey,_cmGlobVerificationManager::CacheEntryValue>
  *i;
  iterator __end1;
  iterator __begin1;
  CacheEntryMap *__range1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_368;
  undefined1 local_348 [8];
  cmGeneratedFileStream verifyScriptFile;
  undefined1 local_c8 [8];
  string stampFile;
  cmAlphaNum local_78;
  undefined1 local_48 [8];
  string scriptFile;
  cmMessenger *messenger_local;
  string *path_local;
  cmGlobVerificationManager *this_local;
  
  scriptFile.field_2._8_8_ = messenger;
  bVar1 = std::
          map<cmGlobVerificationManager::CacheEntryKey,_cmGlobVerificationManager::CacheEntryValue,_std::less<cmGlobVerificationManager::CacheEntryKey>,_std::allocator<std::pair<const_cmGlobVerificationManager::CacheEntryKey,_cmGlobVerificationManager::CacheEntryValue>_>_>
          ::empty(&this->Cache);
  if (bVar1) {
    this_local._7_1_ = true;
  }
  else {
    cmAlphaNum::cmAlphaNum(&local_78,path);
    this_00 = (cmAlphaNum *)((long)&stampFile.field_2 + 8);
    cmAlphaNum::cmAlphaNum(this_00,"/CMakeFiles");
    cmStrCat<>((string *)local_48,&local_78,this_00);
    std::__cxx11::string::string((string *)local_c8,(string *)local_48);
    register0x00000000 = cmsys::SystemTools::MakeDirectory((string *)local_48,(mode_t *)0x0);
    std::__cxx11::string::operator+=((string *)local_48,"/VerifyGlobs.cmake");
    std::__cxx11::string::operator+=((string *)local_c8,"/cmake.verify_globs");
    cmGeneratedFileStream::cmGeneratedFileStream
              ((cmGeneratedFileStream *)local_348,(string *)local_48,false,None);
    cmGeneratedFileStream::SetCopyIfDifferent((cmGeneratedFileStream *)local_348,true);
    bVar2 = std::ios::operator!((ios *)(local_348 + (long)*(_func_int **)((long)local_348 + -0x18)))
    ;
    if ((bVar2 & 1) == 0) {
      std::ostream::operator<<(local_348,std::boolalpha);
      poVar4 = std::operator<<((ostream *)local_348,"# CMAKE generated file: DO NOT EDIT!\n");
      poVar4 = std::operator<<(poVar4,"# Generated by CMake Version ");
      uVar3 = cmVersion::GetMajorVersion();
      poVar4 = (ostream *)std::ostream::operator<<(poVar4,uVar3);
      poVar4 = std::operator<<(poVar4,".");
      uVar3 = cmVersion::GetMinorVersion();
      poVar4 = (ostream *)std::ostream::operator<<(poVar4,uVar3);
      std::operator<<(poVar4,"\n");
      std::operator<<((ostream *)local_348,"cmake_policy(SET CMP0009 NEW)\n");
      __end1 = std::
               map<cmGlobVerificationManager::CacheEntryKey,_cmGlobVerificationManager::CacheEntryValue,_std::less<cmGlobVerificationManager::CacheEntryKey>,_std::allocator<std::pair<const_cmGlobVerificationManager::CacheEntryKey,_cmGlobVerificationManager::CacheEntryValue>_>_>
               ::begin(&this->Cache);
      i = (pair<const_cmGlobVerificationManager::CacheEntryKey,_cmGlobVerificationManager::CacheEntryValue>
           *)std::
             map<cmGlobVerificationManager::CacheEntryKey,_cmGlobVerificationManager::CacheEntryValue,_std::less<cmGlobVerificationManager::CacheEntryKey>,_std::allocator<std::pair<const_cmGlobVerificationManager::CacheEntryKey,_cmGlobVerificationManager::CacheEntryValue>_>_>
             ::end(&this->Cache);
      while (bVar1 = std::operator!=(&__end1,(_Self *)&i), bVar1) {
        __in = std::
               _Rb_tree_iterator<std::pair<const_cmGlobVerificationManager::CacheEntryKey,_cmGlobVerificationManager::CacheEntryValue>_>
               ::operator*(&__end1);
        ptVar5 = std::
                 get<0ul,cmGlobVerificationManager::CacheEntryKey_const,cmGlobVerificationManager::CacheEntryValue>
                           (__in);
        CacheEntryKey::CacheEntryKey
                  ((CacheEntryKey *)
                   &v.Backtraces.
                    super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmListFileBacktrace>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmListFileBacktrace>_>_>
                    ._M_impl.super__Vector_impl_data._M_end_of_storage,ptVar5);
        ptVar6 = std::
                 get<1ul,cmGlobVerificationManager::CacheEntryKey_const,cmGlobVerificationManager::CacheEntryValue>
                           (__in);
        CacheEntryValue::CacheEntryValue((CacheEntryValue *)&__range2,ptVar6);
        if (((byte)__range2 & 1) != 0) {
          std::operator<<((ostream *)local_348,"\n");
          this_02 = &v.Files.
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_end_of_storage;
          __end2 = std::
                   vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmListFileBacktrace>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmListFileBacktrace>_>_>
                   ::begin((vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmListFileBacktrace>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmListFileBacktrace>_>_>
                            *)this_02);
          bt = (pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmListFileBacktrace>
                *)std::
                  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmListFileBacktrace>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmListFileBacktrace>_>_>
                  ::end((vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmListFileBacktrace>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmListFileBacktrace>_>_>
                         *)this_02);
          while (bVar1 = __gnu_cxx::operator!=
                                   (&__end2,(__normal_iterator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmListFileBacktrace>_*,_std::vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmListFileBacktrace>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmListFileBacktrace>_>_>_>
                                             *)&bt), bVar1) {
            local_430 = __gnu_cxx::
                        __normal_iterator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmListFileBacktrace>_*,_std::vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmListFileBacktrace>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmListFileBacktrace>_>_>_>
                        ::operator*(&__end2);
            poVar4 = std::operator<<((ostream *)local_348,"# ");
            ptVar7 = std::get<0ul,std::__cxx11::string,cmListFileBacktrace>(local_430);
            std::operator<<(poVar4,(string *)ptVar7);
            this_01 = scriptFile.field_2._8_8_;
            bt_00 = std::get<1ul,std::__cxx11::string,cmListFileBacktrace>(local_430);
            cmMessenger::PrintBacktraceTitle((cmMessenger *)this_01,(ostream *)local_348,bt_00);
            std::operator<<((ostream *)local_348,"\n");
            __gnu_cxx::
            __normal_iterator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmListFileBacktrace>_*,_std::vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmListFileBacktrace>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmListFileBacktrace>_>_>_>
            ::operator++(&__end2);
          }
          std::allocator<char>::allocator();
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_450,"NEW_GLOB",(allocator<char> *)((long)&__range2_1 + 7));
          CacheEntryKey::PrintGlobCommand
                    ((CacheEntryKey *)
                     &v.Backtraces.
                      super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmListFileBacktrace>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmListFileBacktrace>_>_>
                      ._M_impl.super__Vector_impl_data._M_end_of_storage,(ostream *)local_348,
                     &local_450);
          std::__cxx11::string::~string((string *)&local_450);
          std::allocator<char>::~allocator((allocator<char> *)((long)&__range2_1 + 7));
          std::operator<<((ostream *)local_348,"\n");
          std::operator<<((ostream *)local_348,"set(OLD_GLOB\n");
          __end2_1 = std::
                     vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ::begin((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              *)&v);
          file = (string *)
                 std::
                 vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ::end((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        *)&v);
          while (bVar1 = __gnu_cxx::operator!=
                                   (&__end2_1,
                                    (__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                     *)&file), bVar1) {
            verifyStampFile._504_8_ =
                 __gnu_cxx::
                 __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                 ::operator*(&__end2_1);
            poVar4 = std::operator<<((ostream *)local_348,"  \"");
            poVar4 = std::operator<<(poVar4,(string *)verifyStampFile._504_8_);
            std::operator<<(poVar4,"\"\n");
            __gnu_cxx::
            __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
            ::operator++(&__end2_1);
          }
          std::operator<<((ostream *)local_348,"  )\n");
          poVar4 = std::operator<<((ostream *)local_348,
                                   "if(NOT \"${NEW_GLOB}\" STREQUAL \"${OLD_GLOB}\")\n");
          poVar4 = std::operator<<(poVar4,"  message(\"-- GLOB mismatch!\")\n");
          poVar4 = std::operator<<(poVar4,"  file(TOUCH_NOCREATE \"");
          poVar4 = std::operator<<(poVar4,(string *)local_c8);
          poVar4 = std::operator<<(poVar4,"\")\n");
          std::operator<<(poVar4,"endif()\n");
        }
        CacheEntryValue::~CacheEntryValue((CacheEntryValue *)&__range2);
        CacheEntryKey::~CacheEntryKey
                  ((CacheEntryKey *)
                   &v.Backtraces.
                    super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmListFileBacktrace>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmListFileBacktrace>_>_>
                    ._M_impl.super__Vector_impl_data._M_end_of_storage);
        std::
        _Rb_tree_iterator<std::pair<const_cmGlobVerificationManager::CacheEntryKey,_cmGlobVerificationManager::CacheEntryValue>_>
        ::operator++(&__end1);
      }
      cmGeneratedFileStream::Close((cmGeneratedFileStream *)local_348);
      pcVar8 = (char *)std::__cxx11::string::c_str();
      std::ofstream::ofstream(local_678,pcVar8,_S_out);
      bVar2 = std::ios::operator!((ios *)(local_678 + (long)*(_func_int **)((long)local_678 + -0x18)
                                         ));
      bVar1 = (bVar2 & 1) != 0;
      if (bVar1) {
        std::operator+(&local_698,"Unable to open verification stamp file for write. ",
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_c8
                      );
        cmSystemTools::Error(&local_698);
        std::__cxx11::string::~string((string *)&local_698);
      }
      else {
        std::operator<<((ostream *)local_678,
                        "# This file is generated by CMake for checking of the VerifyGlobs.cmake file\n"
                       );
        std::__cxx11::string::operator=((string *)&this->VerifyScript,(string *)local_48);
        std::__cxx11::string::operator=((string *)&this->VerifyStamp,(string *)local_c8);
      }
      this_local._7_1_ = !bVar1;
      std::ofstream::~ofstream(local_678);
    }
    else {
      std::operator+(&local_368,"Unable to open verification script file for save. ",
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_48);
      cmSystemTools::Error(&local_368);
      std::__cxx11::string::~string((string *)&local_368);
      cmSystemTools::ReportLastSystemError("");
      this_local._7_1_ = false;
    }
    cmGeneratedFileStream::~cmGeneratedFileStream((cmGeneratedFileStream *)local_348);
    std::__cxx11::string::~string((string *)local_c8);
    std::__cxx11::string::~string((string *)local_48);
  }
  return this_local._7_1_;
}

Assistant:

bool cmGlobVerificationManager::SaveVerificationScript(const std::string& path,
                                                       cmMessenger* messenger)
{
  if (this->Cache.empty()) {
    return true;
  }

  std::string scriptFile = cmStrCat(path, "/CMakeFiles");
  std::string stampFile = scriptFile;
  cmSystemTools::MakeDirectory(scriptFile);
  scriptFile += "/VerifyGlobs.cmake";
  stampFile += "/cmake.verify_globs";
  cmGeneratedFileStream verifyScriptFile(scriptFile);
  verifyScriptFile.SetCopyIfDifferent(true);
  if (!verifyScriptFile) {
    cmSystemTools::Error("Unable to open verification script file for save. " +
                         scriptFile);
    cmSystemTools::ReportLastSystemError("");
    return false;
  }

  verifyScriptFile << std::boolalpha;
  verifyScriptFile << "# CMAKE generated file: DO NOT EDIT!\n"
                   << "# Generated by CMake Version "
                   << cmVersion::GetMajorVersion() << "."
                   << cmVersion::GetMinorVersion() << "\n";

  verifyScriptFile << "cmake_policy(SET CMP0009 NEW)\n";

  for (auto const& i : this->Cache) {
    CacheEntryKey k = std::get<0>(i);
    CacheEntryValue v = std::get<1>(i);

    if (!v.Initialized) {
      continue;
    }

    verifyScriptFile << "\n";

    for (auto const& bt : v.Backtraces) {
      verifyScriptFile << "# " << std::get<0>(bt);
      messenger->PrintBacktraceTitle(verifyScriptFile, std::get<1>(bt));
      verifyScriptFile << "\n";
    }

    k.PrintGlobCommand(verifyScriptFile, "NEW_GLOB");
    verifyScriptFile << "\n";

    verifyScriptFile << "set(OLD_GLOB\n";
    for (const std::string& file : v.Files) {
      verifyScriptFile << "  \"" << file << "\"\n";
    }
    verifyScriptFile << "  )\n";

    verifyScriptFile << "if(NOT \"${NEW_GLOB}\" STREQUAL \"${OLD_GLOB}\")\n"
                     << "  message(\"-- GLOB mismatch!\")\n"
                     << "  file(TOUCH_NOCREATE \"" << stampFile << "\")\n"
                     << "endif()\n";
  }
  verifyScriptFile.Close();

  cmsys::ofstream verifyStampFile(stampFile.c_str());
  if (!verifyStampFile) {
    cmSystemTools::Error("Unable to open verification stamp file for write. " +
                         stampFile);
    return false;
  }
  verifyStampFile << "# This file is generated by CMake for checking of the "
                     "VerifyGlobs.cmake file\n";
  this->VerifyScript = scriptFile;
  this->VerifyStamp = stampFile;
  return true;
}